

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_messagebox.cpp
# Opt level: O0

void QtMWidgets::MessageBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  TextFormat TVar2;
  void *_v_1;
  MessageBox *_t_2;
  QString *local_40;
  void *_v;
  MessageBox *_t_1;
  int *result;
  MessageBox *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (MessageBox *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    result = (int *)_o;
    if (_id == 0) {
      buttonClicked((MessageBox *)_o,*_a[1]);
    }
    else if (_id == 1) {
      _q_clicked((MessageBox *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == buttonClicked && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == ReadProperty) {
    local_40 = (QString *)*_a;
    _v = _o;
    if (_id == 0) {
      text((QString *)&_t_2,(MessageBox *)_o);
      QString::operator=(local_40,(QString *)&_t_2);
      QString::~QString((QString *)&_t_2);
    }
    else if (_id == 1) {
      TVar2 = textFormat((MessageBox *)_o);
      *(TextFormat *)&(local_40->d).d = TVar2;
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      setText((MessageBox *)_o,(QString *)*_a);
    }
    else if (_id == 1) {
      setTextFormat((MessageBox *)_o,*(TextFormat *)&(((QString *)*_a)->d).d);
    }
  }
  return;
}

Assistant:

void QtMWidgets::MessageBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<MessageBox *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->buttonClicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        case 1: _t->_q_clicked(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (MessageBox::*)(QAbstractButton * );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&MessageBox::buttonClicked)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<MessageBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast< Qt::TextFormat*>(_v) = _t->textFormat(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<MessageBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast< Qt::TextFormat*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}